

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  pointer *__return_storage_ptr__;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  PolicyStatus PVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  cmMakefile *this_00;
  cmake *this_01;
  string *psVar5;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool local_1e7;
  bool local_1e6;
  bool local_1e5;
  string local_190;
  reference local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_130 [8];
  string err;
  undefined1 local_e8 [8];
  anon_class_56_7_c6d6a0c4 findInDir;
  bool cmp0118new;
  bool cmp0163new;
  PolicyStatus cmp0118;
  PolicyStatus cmp0163;
  PolicyStatus cmp0115;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  string *lPath;
  cmMakefile *makefile;
  string *local_28;
  string *cmp0115Warning_local;
  string *error_local;
  cmSourceFile *this_local;
  
  local_28 = cmp0115Warning;
  cmp0115Warning_local = error;
  error_local = (string *)this;
  bVar1 = GetIsGenerated(this,GlobalAndLocal);
  if (bVar1) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)&makefile,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&makefile);
    std::__cxx11::string::~string((string *)&makefile);
    this->FindFullPathFailed = false;
    this_local._7_1_ = 1;
    goto LAB_002e9a92;
  }
  if ((this->FindFullPathFailed & 1U) != 0) {
    this_local._7_1_ = 0;
    goto LAB_002e9a92;
  }
  this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
  __return_storage_ptr__ =
       &exts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)__return_storage_ptr__,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90,this_01);
  PVar2 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  PVar3 = cmMakefile::GetPolicyStatus(this_00,CMP0163,false);
  PVar4 = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  local_1e5 = WARN < PVar3;
  findInDir.makefile._7_1_ = local_1e5;
  local_1e6 = true;
  if (!local_1e5) {
    local_1e7 = WARN < PVar4;
    local_1e6 = local_1e7;
  }
  findInDir.makefile._6_1_ = local_1e6;
  findInDir.this = (cmSourceFile *)local_90;
  findInDir._24_8_ = local_28;
  findInDir.cmp0115Warning._0_1_ = local_1e6;
  local_e8 = (undefined1  [8])this;
  findInDir.exts =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__return_storage_ptr__;
  findInDir.lPath._0_4_ = PVar2;
  findInDir._40_8_ = this_00;
  bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location);
  if (bVar1) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_e8,psVar5);
    if (!bVar1) {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                        ((anon_class_56_7_c6d6a0c4 *)local_e8,psVar5);
      if (!bVar1) goto LAB_002e9804;
    }
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)(err.field_2._M_local_buf + 8));
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()
                      ((anon_class_56_7_c6d6a0c4 *)local_e8,(string *)(err.field_2._M_local_buf + 8)
                      );
    std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
LAB_002e9804:
      cmStrCat<char_const(&)[28],std::__cxx11::string_const&>
                ((string *)local_130,(char (*) [28])"Cannot find source file:\n  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__);
      if (PVar2 < NEW) {
        cmStrCat<std::__cxx11::string&,char_const(&)[18]>
                  ((string *)&__range2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   (char (*) [18])0x1012154);
        std::__cxx11::string::operator=((string *)local_130,(string *)&__range2);
        std::__cxx11::string::~string((string *)&__range2);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90);
        ext = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_90);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&ext), bVar1) {
          local_170 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          cmStrCat<std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&>
                    (&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     (char (*) [3])0x103f816,local_170);
          std::__cxx11::string::operator=((string *)local_130,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)__return_storage_ptr__);
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("FILE_SET",8);
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        std::__cxx11::string::operator+=
                  ((string *)local_130,
                   "\nHint: the FILE_SET keyword may only appear after a visibility specifier or another FILE_SET within the target_sources() command."
                  );
      }
      if (cmp0115Warning_local == (string *)0x0) {
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)local_130);
      }
      else {
        std::__cxx11::string::operator=((string *)cmp0115Warning_local,(string *)local_130);
      }
      this->FindFullPathFailed = true;
      this_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)local_130);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_90);
  std::__cxx11::string::~string
            ((string *)
             &exts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_002e9a92:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 (or CMP0163) was set
  //       to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0163 = makefile->GetPolicyStatus(cmPolicies::CMP0163);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0163new =
    cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
  bool const cmp0118new =
    cmp0163new || (cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN);

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    // Is this file globally marked as generated? Then mark so locally.
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          // Is this file globally marked as generated? Then mark so locally.
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (lPath == "FILE_SET"_s) {
    err += "\nHint: the FILE_SET keyword may only appear after a visibility "
           "specifier or another FILE_SET within the target_sources() "
           "command.";
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}